

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O2

bool Trace(DVector3 *start,sector_t_conflict *sector,DVector3 *direction,double maxDist,
          ActorFlags *actorMask,DWORD wallMask,AActor *ignore,FTraceResults *res,DWORD flags,
          _func_ETraceStatus_FTraceResults_ptr_void_ptr *callback,void *callbackdata)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  double local_608;
  double dStack_600;
  DVector2 local_5f8;
  double local_5e8;
  AActor *local_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  FTraceInfo local_5c8;
  FTraceResults local_100;
  
  bVar4 = false;
  local_5e8 = maxDist;
  local_5e0 = ignore;
  memset(&local_100,0,0xd0);
  local_100.Distance = 3.4028234663852886e+38;
  local_100.Fraction = 3.4028234663852886e+38;
  dVar1 = start->Z;
  local_608 = start->X;
  dStack_600 = start->Y;
  local_5c8.Start.X = local_608;
  local_5c8.Start.Y = dStack_600;
  local_5c8.Start.Z = dVar1;
  while (((sector->planes[1].Flags & 0x1d0U) == 0x100 &&
         (sectorPortals.Array[sector->Portals[1]].mPlaneZ <= dVar1 &&
          dVar1 != sectorPortals.Array[sector->Portals[1]].mPlaneZ))) {
    local_608 = local_608 + sectorPortals.Array[sector->Portals[1]].mDisplacement.X;
    dStack_600 = dStack_600 + sectorPortals.Array[sector->Portals[1]].mDisplacement.Y;
    local_5f8.X = local_608;
    local_5f8.Y = dStack_600;
    local_5c8.Start.X = local_608;
    local_5c8.Start.Y = dStack_600;
    sector = P_PointInSector(&local_5f8);
    bVar4 = true;
  }
  if (!bVar4) {
    while (((sector->planes[0].Flags & 0x1d0U) == 0x100 &&
           (dVar1 <= sectorPortals.Array[sector->Portals[0]].mPlaneZ))) {
      local_608 = local_608 + sectorPortals.Array[sector->Portals[0]].mDisplacement.X;
      dStack_600 = dStack_600 + sectorPortals.Array[sector->Portals[0]].mDisplacement.Y;
      local_5f8.X = local_608;
      local_5f8.Y = dStack_600;
      local_5c8.Start.X = local_608;
      local_5c8.Start.Y = dStack_600;
      sector = P_PointInSector(&local_5f8);
    }
  }
  local_5c8.ActorMask = (ActorFlags)actorMask->Value;
  iVar3 = 7;
  if (local_5c8.ActorMask.Value == 0) {
    iVar3 = 1;
  }
  dVar2 = direction->Z;
  local_5d8 = direction->X;
  uStack_5d0 = direction->Y;
  local_5c8.IgnoreThis = local_5e0;
  local_5c8.MaxDist = local_5e8;
  local_5c8.EnterDist = 0.0;
  local_5c8.TraceCallback = callback;
  local_5c8.TraceCallbackData = callbackdata;
  local_5c8.TraceFlags = flags;
  local_5c8.Results = res;
  local_5c8.inshootthrough = 1;
  local_5c8.sectorsel = 0;
  local_5c8.startfrac = 0.0;
  local_5c8.Vec.X = local_5d8;
  local_5c8.Vec.Y = uStack_5d0;
  local_5c8.Vec.Z = dVar2;
  local_5c8.WallMask = wallMask;
  local_5c8.CurSector = sector;
  local_5c8.limitz = dVar1;
  local_5c8.ptflags = iVar3;
  memset(res,0,0xd0);
  bVar5 = callback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0 & (byte)flags >> 4;
  if (bVar5 == 1) {
    local_100.HitType = TRACE_CrossingPortal;
    local_100.SrcFromTarget.X = local_608;
    local_100.SrcFromTarget.Y = dStack_600;
    local_100.HitPos.X = local_608;
    local_100.HitPos.Y = dStack_600;
    local_100.HitVector.X._0_4_ = (undefined4)local_5d8;
    local_100.HitVector.X._4_4_ = local_5d8._4_4_;
    local_100.HitVector.Y._0_4_ = (undefined4)uStack_5d0;
    local_100.HitVector.Y._4_4_ = uStack_5d0._4_4_;
    local_100.HitPos.Z = dVar1;
    local_100.HitVector.Z = dVar2;
    local_100.SrcFromTarget.Z = dVar1;
    (*callback)(&local_100,callbackdata);
  }
  bVar4 = FTraceInfo::TraceTraverse(&local_5c8,iVar3);
  if (bVar5 != 0) {
    local_100.HitType = TRACE_CrossingPortal;
    local_100.HitPos.Z = ((local_5c8.Results)->HitPos).Z;
    local_100.HitPos.X = ((local_5c8.Results)->HitPos).X;
    local_100.HitPos.Y = ((local_5c8.Results)->HitPos).Y;
    local_100.HitVector.Z = local_5c8.Vec.Z;
    local_100.HitVector.X._0_4_ = local_5c8.Vec.X._0_4_;
    local_100.HitVector.X._4_4_ = local_5c8.Vec.X._4_4_;
    local_100.HitVector.Y._0_4_ = local_5c8.Vec.Y._0_4_;
    local_100.HitVector.Y._4_4_ = local_5c8.Vec.Y._4_4_;
    local_100.SrcFromTarget.X = local_100.HitPos.X;
    local_100.SrcFromTarget.Y = local_100.HitPos.Y;
    local_100.SrcFromTarget.Z = local_100.HitPos.Z;
    (*callback)(&local_100,local_5c8.TraceCallbackData);
  }
  if (bVar4) {
    if ((flags & 1) == 0) {
      return true;
    }
    if (res->HitType - TRACE_HitFloor < 2) {
      if ((res->HitTexture).texnum != skyflatnum.texnum) {
        return true;
      }
    }
    else {
      if (res->HitType != TRACE_HitWall) {
        return true;
      }
      if (res->Tier != '\x01') {
        return true;
      }
      iVar3 = res->Line->frontsector->planes[1].Texture.texnum;
      if (iVar3 != skyflatnum.texnum) {
        return true;
      }
      if (res->Line->backsector->planes[1].Texture.texnum != iVar3) {
        return true;
      }
    }
    res->HitType = TRACE_HitNone;
  }
  return false;
}

Assistant:

bool Trace(const DVector3 &start, sector_t *sector, const DVector3 &direction, double maxDist,
	ActorFlags actorMask, DWORD wallMask, AActor *ignore, FTraceResults &res, DWORD flags,
	ETraceStatus(*callback)(FTraceResults &res, void *), void *callbackdata)
{
	FTraceInfo inf;
	FTraceResults tempResult;

	memset(&tempResult, 0, sizeof(tempResult));
	tempResult.Fraction = tempResult.Distance = NO_VALUE;

	inf.Start = start;
	GetPortalTransition(inf.Start, sector);
	inf.ptflags = actorMask ? PT_ADDLINES|PT_ADDTHINGS|PT_COMPATIBLE : PT_ADDLINES;
	inf.Vec = direction;
	inf.ActorMask = actorMask;
	inf.WallMask = wallMask;
	inf.IgnoreThis = ignore;
	inf.CurSector = sector;
	inf.MaxDist = maxDist;
	inf.EnterDist = 0;
	inf.TraceCallback = callback;
	inf.TraceCallbackData = callbackdata;
	inf.TraceFlags = flags;
	inf.Results = &res;
	inf.inshootthrough = true;
	inf.sectorsel=0;
	inf.startfrac = 0;
	inf.limitz = inf.Start.Z;
	memset(&res, 0, sizeof(res));

	if ((flags & TRACE_ReportPortals) && callback != NULL)
	{
		tempResult.HitType = TRACE_CrossingPortal;
		tempResult.HitPos = tempResult.SrcFromTarget = inf.Start;
		tempResult.HitVector = inf.Vec;
		callback(tempResult, inf.TraceCallbackData);
	}
	bool reslt = inf.TraceTraverse(inf.ptflags);

	if ((flags & TRACE_ReportPortals) && callback != NULL)
	{
		tempResult.HitType = TRACE_CrossingPortal;
		tempResult.HitPos = tempResult.SrcFromTarget = inf.Results->HitPos;
		tempResult.HitVector = inf.Vec;
		callback(tempResult, inf.TraceCallbackData);
	}

	if (reslt)
	{ 
		return flags ? EditTraceResult(flags, res) : true;
	}
	else
	{
		return false;
	}
}